

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O3

int xml2_read_cb(void *context,char *buffer,int len)

{
  long *plVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  size_t used;
  size_t outbytes;
  void *d;
  size_t local_30;
  ulong local_28;
  char *local_20;
  
  local_30 = 0;
  plVar1 = (long *)**(undefined8 **)((long)context + 0x818);
  if (plVar1[8] == 0) {
    uVar4 = 0;
  }
  else {
    local_28 = (ulong)len;
    local_20 = buffer;
    uVar3 = rd_contents((archive_read *)context,&local_20,&local_28,&local_30,plVar1[8]);
    sVar2 = local_30;
    uVar4 = (ulong)uVar3;
    if (uVar3 == 0) {
      __archive_read_consume((archive_read *)context,local_30);
      plVar1[8] = plVar1[8] - sVar2;
      *plVar1 = *plVar1 + sVar2;
      plVar1[9] = plVar1[9] + local_28;
      uVar4 = local_28;
    }
  }
  return (int)uVar4;
}

Assistant:

static int
xml2_read_cb(void *context, char *buffer, int len)
{
	struct archive_read *a;
	struct xar *xar;
	const void *d;
	size_t outbytes;
	size_t used = 0;
	int r;

	a = (struct archive_read *)context;
	xar = (struct xar *)(a->format->data);

	if (xar->toc_remaining <= 0)
		return (0);
	d = buffer;
	outbytes = len;
	r = rd_contents(a, &d, &outbytes, &used, xar->toc_remaining);
	if (r != ARCHIVE_OK)
		return (r);
	__archive_read_consume(a, used);
	xar->toc_remaining -= used;
	xar->offset += used;
	xar->toc_total += outbytes;
	PRINT_TOC(buffer, len);

	return ((int)outbytes);
}